

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-desugar.cc
# Opt level: O0

void ParseOptions(int argc,char **argv)

{
  anon_class_1_0_00000001 local_1e1;
  Callback local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  anon_class_1_0_00000001 local_191;
  NullCallback local_190;
  anon_class_1_0_00000001 local_169;
  NullCallback local_168;
  anon_class_1_0_00000001 local_141;
  NullCallback local_140;
  anon_class_1_0_00000001 local_119;
  NullCallback local_118;
  anon_class_1_0_00000001 local_f1;
  NullCallback local_f0;
  anon_class_1_0_00000001 local_c9;
  Callback local_c8;
  undefined1 local_a8 [8];
  OptionParser parser;
  char **argv_local;
  int argc_local;
  
  parser.on_error_._M_invoker = (_Invoker_type)argv;
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_a8,"wat-desugar",
             "  read a file in the wasm s-expression format and format it.\n\nexamples:\n  # write output to stdout\n  $ wat-desugar test.wat\n\n  # write output to test2.wat\n  $ wat-desugar test.wat -o test2.wat\n\n  # generate names for indexed variables\n  $ wat-desugar --generate-names test.wat\n"
            );
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__0,void>
            ((function<void(char_const*)> *)&local_c8,&local_c9);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'o',"output","FILE","Output file for the formatted file",
             &local_c8);
  std::function<void_(const_char_*)>::~function(&local_c8);
  std::function<void()>::function<ParseOptions(int,char**)::__1,void>
            ((function<void()> *)&local_f0,&local_f1);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,"debug-parser","Turn on debugging the parser of wat files",
             &local_f0);
  std::function<void_()>::~function(&local_f0);
  std::function<void()>::function<ParseOptions(int,char**)::__2,void>
            ((function<void()> *)&local_118,&local_119);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'f',"fold-exprs","Write folded expressions where possible",
             &local_118);
  std::function<void_()>::~function(&local_118);
  std::function<void()>::function<ParseOptions(int,char**)::__3,void>
            ((function<void()> *)&local_140,&local_141);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,"inline-exports","Write all exports inline",&local_140);
  std::function<void_()>::~function(&local_140);
  std::function<void()>::function<ParseOptions(int,char**)::__4,void>
            ((function<void()> *)&local_168,&local_169);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,"inline-imports","Write all imports inline",&local_168);
  std::function<void_()>::~function(&local_168);
  wabt::Features::AddOptions(&s_features,(OptionParser *)local_a8);
  std::function<void()>::function<ParseOptions(int,char**)::__5,void>
            ((function<void()> *)&local_190,&local_191);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,"generate-names",
             "Give auto-generated names to non-named functions, types, etc.",&local_190);
  std::function<void_()>::~function(&local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"filename",&local_1b9);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__6,void>
            ((function<void(char_const*)> *)&local_1e0,&local_1e1);
  wabt::OptionParser::AddArgument((OptionParser *)local_a8,&local_1b8,One,&local_1e0);
  std::function<void_(const_char_*)>::~function(&local_1e0);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  wabt::OptionParser::Parse((OptionParser *)local_a8,argc,(char **)parser.on_error_._M_invoker);
  wabt::OptionParser::~OptionParser((OptionParser *)local_a8);
  return;
}

Assistant:

static void ParseOptions(int argc, char** argv) {
  OptionParser parser("wat-desugar", s_description);

  parser.AddOption('o', "output", "FILE", "Output file for the formatted file",
                   [](const char* argument) { s_outfile = argument; });
  parser.AddOption("debug-parser", "Turn on debugging the parser of wat files",
                   []() { s_debug_parsing = true; });
  parser.AddOption('f', "fold-exprs", "Write folded expressions where possible",
                   []() { s_fold_exprs = true; });
  parser.AddOption("inline-exports", "Write all exports inline",
                   []() { s_inline_export = true; });
  parser.AddOption("inline-imports", "Write all imports inline",
                   []() { s_inline_import = true; });
  s_features.AddOptions(&parser);
  parser.AddOption(
      "generate-names",
      "Give auto-generated names to non-named functions, types, etc.",
      []() { s_generate_names = true; });

  parser.AddArgument("filename", OptionParser::ArgumentCount::One,
                     [](const char* argument) { s_infile = argument; });
  parser.Parse(argc, argv);
}